

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-cpu.c
# Opt level: O0

void ggml_threadpool_free(ggml_threadpool *threadpool)

{
  int iVar1;
  long lVar2;
  int iVar3;
  pthread_mutex_t *in_RDI;
  size_t workers_size;
  int32_t rc;
  int j;
  ggml_compute_state *workers;
  int n_threads;
  int local_1c;
  
  if (in_RDI != (pthread_mutex_t *)0x0) {
    iVar1 = in_RDI[7].__data.__lock;
    lVar2 = *(long *)((long)in_RDI + 0x110);
    pthread_mutex_lock(in_RDI);
    LOCK();
    *(undefined1 *)((long)in_RDI + 0x104) = 1;
    UNLOCK();
    LOCK();
    *(undefined1 *)((long)in_RDI + 0x105) = 0;
    UNLOCK();
    pthread_cond_broadcast((pthread_cond_t *)(in_RDI + 1));
    pthread_mutex_unlock(in_RDI);
    for (local_1c = 1; local_1c < iVar1; local_1c = local_1c + 1) {
      iVar3 = pthread_join(*(pthread_t *)(lVar2 + (long)local_1c * 0x220),(void **)0x0);
      if ((iVar3 != 0) && (iVar3 != 1)) {
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-cpu/ggml-cpu.c"
                   ,0xa23,"GGML_ASSERT(%s) failed",
                   "rc == GGML_EXIT_SUCCESS || rc == GGML_EXIT_ABORTED");
      }
    }
    pthread_mutex_destroy(in_RDI);
    pthread_cond_destroy((pthread_cond_t *)(in_RDI + 1));
    ggml_aligned_free(*(undefined8 *)((long)in_RDI + 0x110),(long)iVar1 * 0x220);
    ggml_aligned_free(in_RDI,0x140);
  }
  return;
}

Assistant:

void ggml_threadpool_free(struct ggml_threadpool* threadpool) {
    if (!threadpool) return;

    const int n_threads = threadpool->n_threads_max;

#ifndef GGML_USE_OPENMP
    struct ggml_compute_state* workers = threadpool->workers;

    ggml_mutex_lock(&threadpool->mutex);

    threadpool->stop = true;
    threadpool->pause = false;

    ggml_cond_broadcast(&threadpool->cond);
    ggml_mutex_unlock(&threadpool->mutex);

    for (int j = 1; j < n_threads; j++) {
        int32_t rc = ggml_thread_join(workers[j].thrd, NULL);
        GGML_ASSERT(rc == GGML_EXIT_SUCCESS || rc == GGML_EXIT_ABORTED);
        UNUSED(rc);
    }

    ggml_mutex_destroy(&threadpool->mutex);
    ggml_cond_destroy(&threadpool->cond);
#endif // GGML_USE_OPENMP

    const size_t workers_size = sizeof(struct ggml_compute_state) * n_threads;
    ggml_aligned_free(threadpool->workers, workers_size);
    ggml_aligned_free(threadpool, sizeof(struct ggml_threadpool));
}